

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O1

PointSet * __thiscall
hnsw::HNSWIndex::SelectNeighbors
          (PointSet *__return_storage_ptr__,HNSWIndex *this,float *q,MaxHeap *candidates,uint32_t M)

{
  pointer *pppVar1;
  pair<unsigned_int,_float> *__args;
  iterator __position;
  long lVar2;
  
  lVar2 = (long)(candidates->super_MaxHeapImpl).c.
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(candidates->super_MaxHeapImpl).c.
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  while ((ulong)M < (ulong)(lVar2 >> 3)) {
    std::
    priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
    ::pop(&candidates->super_MaxHeapImpl);
    lVar2 = (long)(candidates->super_MaxHeapImpl).c.
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(candidates->super_MaxHeapImpl).c.
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  reserve(__return_storage_ptr__,(ulong)M);
  while (__args = (candidates->super_MaxHeapImpl).c.
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        __args != (candidates->super_MaxHeapImpl).c.
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
      _M_realloc_insert<std::pair<unsigned_int,float>const&>
                ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  *)__return_storage_ptr__,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      pppVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    std::
    priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
    ::pop(&candidates->super_MaxHeapImpl);
  }
  return __return_storage_ptr__;
}

Assistant:

PointSet SelectNeighbors(const float *q, MaxHeap &candidates, uint32_t M) {
    while (candidates.size() > M) {
      candidates.pop();
    }
    PointSet result;
    result.reserve(M);
    while (!candidates.empty()) {
      result.push_back(candidates.top());
      candidates.pop();
    }
    return result;
  }